

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool fast_float::long_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *x,limb_span y)

{
  limb_span s;
  limb_span s_00;
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  size_t in_R8;
  limb_span y_00;
  undefined1 local_480 [8];
  limb_span zis;
  undefined1 local_460 [8];
  stackvec<(unsigned_short)62> zi;
  limb yi;
  size_t index;
  limb y0;
  limb_span zs;
  undefined1 local_230 [8];
  stackvec<(unsigned_short)62> z;
  limb_span xs;
  stackvec<(unsigned_short)62> *x_local;
  limb_span y_local;
  
  y_local.ptr = (unsigned_long *)y.length;
  x_local = (stackvec<(unsigned_short)62> *)y.ptr;
  sVar2 = stackvec<(unsigned_short)62>::len(x);
  span<unsigned_long>::span((span<unsigned_long> *)&z.length,x->data,sVar2);
  zs.length = z._496_8_;
  s_00.length = (size_t)xs.ptr;
  s_00.ptr = (unsigned_long *)z._496_8_;
  stackvec<(unsigned_short)62>::stackvec((stackvec<(unsigned_short)62> *)local_230,s_00);
  sVar2 = stackvec<(unsigned_short)62>::len((stackvec<(unsigned_short)62> *)local_230);
  span<unsigned_long>::span((span<unsigned_long> *)&y0,(unsigned_long *)local_230,sVar2);
  sVar2 = span<unsigned_long>::len((span<unsigned_long> *)&x_local);
  if (sVar2 != 0) {
    puVar3 = span<unsigned_long>::operator[]((span<unsigned_long> *)&x_local,0);
    bVar1 = small_mul<(unsigned_short)62>(x,*puVar3);
    if (!bVar1) {
      return false;
    }
    for (yi = 1; sVar2 = span<unsigned_long>::len((span<unsigned_long> *)&x_local), yi < sVar2;
        yi = yi + 1) {
      puVar3 = span<unsigned_long>::operator[]((span<unsigned_long> *)&x_local,yi);
      zi._496_8_ = *puVar3;
      stackvec<(unsigned_short)62>::stackvec((stackvec<(unsigned_short)62> *)local_460);
      if (zi._496_8_ != 0) {
        stackvec<(unsigned_short)62>::set_len((stackvec<(unsigned_short)62> *)local_460,0);
        zis.length = y0;
        s.length = (size_t)zs.ptr;
        s.ptr = (unsigned_long *)y0;
        bVar1 = stackvec<(unsigned_short)62>::try_extend
                          ((stackvec<(unsigned_short)62> *)local_460,s);
        if (!bVar1) {
          return false;
        }
        bVar1 = small_mul<(unsigned_short)62>((stackvec<(unsigned_short)62> *)local_460,zi._496_8_);
        if (!bVar1) {
          return false;
        }
        sVar2 = stackvec<(unsigned_short)62>::len((stackvec<(unsigned_short)62> *)local_460);
        span<unsigned_long>::span((span<unsigned_long> *)local_480,(unsigned_long *)local_460,sVar2)
        ;
        y_00.length = yi;
        y_00.ptr = zis.ptr;
        bVar1 = large_add_from<(unsigned_short)62>
                          ((fast_float *)x,(stackvec<(unsigned_short)62> *)local_480,y_00,in_R8);
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  stackvec<(unsigned_short)62>::normalize(x);
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool long_mul(stackvec<size>& x, limb_span y) noexcept {
  limb_span xs = limb_span(x.data, x.len());
  stackvec<size> z(xs);
  limb_span zs = limb_span(z.data, z.len());

  if (y.len() != 0) {
    limb y0 = y[0];
    FASTFLOAT_TRY(small_mul(x, y0));
    for (size_t index = 1; index < y.len(); index++) {
      limb yi = y[index];
      stackvec<size> zi;
      if (yi != 0) {
        // re-use the same buffer throughout
        zi.set_len(0);
        FASTFLOAT_TRY(zi.try_extend(zs));
        FASTFLOAT_TRY(small_mul(zi, yi));
        limb_span zis = limb_span(zi.data, zi.len());
        FASTFLOAT_TRY(large_add_from(x, zis, index));
      }
    }
  }

  x.normalize();
  return true;
}